

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O1

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdgesBruteForce
          (S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  S2ShapeIndex *pSVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  int edge_id;
  uint uVar4;
  ulong uVar5;
  S2Shape *shape;
  
  pSVar1 = this->index_;
  uVar2 = (*pSVar1->_vptr_S2ShapeIndex[2])(pSVar1);
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      iVar3 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,uVar5);
      shape = (S2Shape *)CONCAT44(extraout_var,iVar3);
      if (shape != (S2Shape *)0x0) {
        iVar3 = (*shape->_vptr_S2Shape[2])(shape);
        if (0 < iVar3) {
          edge_id = 0;
          do {
            MaybeAddResult(this,shape,edge_id);
            edge_id = edge_id + 1;
          } while (iVar3 != edge_id);
        }
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != uVar2);
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdgesBruteForce() {
  for (S2Shape* shape : *index_) {
    if (shape == nullptr) continue;
    int num_edges = shape->num_edges();
    for (int e = 0; e < num_edges; ++e) {
      MaybeAddResult(*shape, e);
    }
  }
}